

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_ldm.c
# Opt level: O0

size_t ZSTD_ldm_generateSequences_internal
                 (ldmState_t *ldmState,rawSeqStore_t *rawSeqStore,ldmParams_t *params,void *src,
                 size_t srcSize)

{
  uint len;
  U32 UVar1;
  U32 numTagBits;
  U32 UVar2;
  uint uVar3;
  uint uVar4;
  U32 UVar5;
  undefined4 uVar6;
  U64 hashPower_00;
  BYTE *pBVar7;
  undefined4 uVar8;
  ldmParams_t ldmParams;
  ldmParams_t ldmParams_00;
  ldmParams_t ldmParams_01;
  U32 UVar9;
  U32 hbits;
  U32 UVar10;
  BYTE *pBVar11;
  ldmState_t *plVar12;
  ldmState_t *plVar13;
  ldmEntry_t *plVar14;
  BYTE *pMatch_00;
  long lVar15;
  long lVar16;
  int *piVar17;
  BYTE *in_RCX;
  ldmParams_t *in_RDX;
  ulong uVar18;
  long *in_RSI;
  ldmState_t *in_RDI;
  long in_R8;
  rawSeq *seq;
  U32 offset;
  U32 matchIndex;
  BYTE *pMatch_1;
  BYTE *lowMatchPtr;
  BYTE *matchEnd;
  BYTE *pMatch;
  BYTE *curMatchBase;
  size_t curTotalMatchLength;
  size_t curBackwardMatchLength;
  size_t curForwardMatchLength;
  U32 checksum;
  size_t bestMatchLength;
  ldmEntry_t *cur;
  ldmEntry_t *bucket;
  ldmEntry_t *bestEntry;
  size_t backwardMatchLength;
  size_t forwardMatchLength;
  U32 current;
  size_t mLength;
  U64 rollingHash;
  BYTE *lastHashed;
  BYTE *ip;
  BYTE *anchor;
  BYTE *ilimit;
  BYTE *iend;
  BYTE *istart;
  BYTE *lowPrefixPtr;
  BYTE *dictEnd;
  BYTE *dictStart;
  BYTE *dictBase;
  BYTE *base;
  U32 lowestIndex;
  U32 dictLimit;
  U32 ldmTagMask;
  U32 hashEveryLog;
  U32 ldmBucketSize;
  U32 hBits;
  U64 hashPower;
  U32 minMatchLength;
  int extDict;
  BYTE *in_stack_fffffffffffffdf8;
  BYTE *mEnd;
  ldmState_t *in_stack_fffffffffffffe08;
  BYTE *in_stack_fffffffffffffe10;
  ldmState_t *ldmState_00;
  undefined4 in_stack_fffffffffffffe20;
  uint uVar19;
  ldmState_t *lastHash;
  ldmState_t *state;
  BYTE *pBVar20;
  BYTE *pBVar21;
  BYTE *pBVar22;
  undefined4 in_stack_fffffffffffffe48;
  U32 UVar23;
  uint uVar24;
  ulong local_130;
  size_t local_128;
  size_t local_120;
  ulong local_110;
  ldmEntry_t *local_108;
  ldmEntry_t *local_e0;
  size_t local_d8;
  size_t local_d0;
  U64 local_b8;
  BYTE *local_b0;
  BYTE *local_a8;
  BYTE *local_a0;
  
  UVar9 = ZSTD_window_hasExtDict(in_RDI->window);
  len = in_RDX->minMatchLength;
  hashPower_00 = in_RDI->hashPower;
  hbits = in_RDX->hashLog - in_RDX->bucketSizeLog;
  UVar1 = in_RDX->bucketSizeLog;
  numTagBits = in_RDX->hashEveryLog;
  UVar2 = in_RDX->hashEveryLog;
  uVar3 = (in_RDI->window).dictLimit;
  UVar23 = uVar3;
  if (UVar9 != 0) {
    UVar23 = (in_RDI->window).lowLimit;
  }
  pBVar7 = (in_RDI->window).base;
  if (UVar9 == 0) {
    pBVar21 = (BYTE *)0x0;
    pBVar11 = (BYTE *)0x0;
    plVar12 = (ldmState_t *)0x0;
  }
  else {
    pBVar21 = (in_RDI->window).dictBase;
    pBVar11 = pBVar21 + UVar23;
    plVar12 = (ldmState_t *)(pBVar21 + uVar3);
  }
  plVar13 = (ldmState_t *)(in_RCX + in_R8);
  uVar19 = len;
  if (len < 9) {
    uVar19 = 8;
  }
  uVar18 = (ulong)uVar19;
  local_b0 = (BYTE *)0x0;
  local_b8 = 0;
  lastHash = plVar13;
  state = plVar12;
  pBVar20 = pBVar11;
  pBVar22 = pBVar21;
  uVar24 = UVar23;
  local_a8 = in_RCX;
  local_a0 = in_RCX;
  do {
    while( true ) {
      if ((BYTE *)((long)plVar13 - uVar18) < local_a8) {
        return (long)plVar13 - (long)local_a0;
      }
      local_d0 = 0;
      local_d8 = 0;
      local_e0 = (ldmEntry_t *)0x0;
      if (local_a8 == in_RCX) {
        local_b8 = ZSTD_ldm_getRollingHash(local_a8,len);
      }
      else {
        local_b8 = ZSTD_ldm_updateHash(local_b8,*local_b0,local_b0[len],hashPower_00);
      }
      local_b0 = local_a8;
      UVar10 = ZSTD_ldm_getTag(local_b8,hbits,numTagBits);
      if (UVar10 == (1 << ((byte)UVar2 & 0x1f)) - 1U) break;
      local_a8 = local_a8 + 1;
    }
    ldmState_00 = in_RDI;
    UVar10 = ZSTD_ldm_getSmallHash(local_b8,hbits);
    plVar14 = ZSTD_ldm_getBucket(ldmState_00,(ulong)UVar10,*in_RDX);
    local_110 = 0;
    UVar10 = ZSTD_ldm_getChecksum(local_b8,hbits);
    for (local_108 = plVar14; local_108 < plVar14 + (uint)(1 << ((byte)UVar1 & 0x1f));
        local_108 = local_108 + 1) {
      if ((local_108->checksum == UVar10) && (UVar23 < local_108->offset)) {
        if (UVar9 == 0) {
          uVar4 = local_108->offset;
          local_120 = ZSTD_count((BYTE *)ldmState_00,in_stack_fffffffffffffe10,
                                 (BYTE *)in_stack_fffffffffffffe08);
          if (len <= local_120) {
            local_128 = ZSTD_ldm_countBackwardsMatch
                                  (local_a8,local_a0,pBVar7 + uVar4,pBVar7 + uVar3);
            local_130 = local_120 + local_128;
            goto LAB_0021ef45;
          }
        }
        else {
          in_stack_fffffffffffffe10 = pBVar7;
          if (local_108->offset < uVar3) {
            in_stack_fffffffffffffe10 = pBVar21;
          }
          pMatch_00 = in_stack_fffffffffffffe10 + local_108->offset;
          in_stack_fffffffffffffe08 = plVar13;
          if (local_108->offset < uVar3) {
            in_stack_fffffffffffffe08 = plVar12;
          }
          mEnd = pBVar7 + uVar3;
          if (local_108->offset < uVar3) {
            mEnd = pBVar11;
          }
          local_120 = ZSTD_count_2segments
                                ((BYTE *)ldmState_00,in_stack_fffffffffffffe10,
                                 (BYTE *)in_stack_fffffffffffffe08,mEnd,in_stack_fffffffffffffdf8);
          if (len <= local_120) {
            local_128 = ZSTD_ldm_countBackwardsMatch(local_a8,local_a0,pMatch_00,mEnd);
            local_130 = local_120 + local_128;
LAB_0021ef45:
            if (local_110 < local_130) {
              local_110 = local_130;
              local_d0 = local_120;
              local_d8 = local_128;
              local_e0 = local_108;
            }
          }
        }
      }
    }
    UVar10 = (U32)((ulong)in_stack_fffffffffffffe10 >> 0x20);
    if (local_e0 == (ldmEntry_t *)0x0) {
      ldmParams._8_8_ = pBVar20;
      ldmParams._0_8_ = state;
      ldmParams._16_8_ = pBVar22;
      ZSTD_ldm_makeEntryAndInsertByTag
                ((ldmState_t *)CONCAT44(uVar19,in_stack_fffffffffffffe20),(U64)ldmState_00,UVar10,
                 (U32)in_stack_fffffffffffffe10,ldmParams);
      local_a8 = local_a8 + 1;
    }
    else {
      lVar15 = local_d0 + local_d8;
      lVar16 = (long)local_a8 - local_d8;
      UVar5 = local_e0->offset;
      piVar17 = (int *)(*in_RSI + in_RSI[2] * 0xc);
      if (in_RSI[2] == in_RSI[3]) {
        return 0xffffffffffffffba;
      }
      piVar17[1] = (int)lVar16 - (int)local_a0;
      piVar17[2] = (int)lVar15;
      *piVar17 = ((int)local_a8 - (int)pBVar7) - UVar5;
      in_RSI[2] = in_RSI[2] + 1;
      ldmParams_00._8_8_ = pBVar20;
      ldmParams_00._0_8_ = state;
      ldmParams_00._16_8_ = pBVar22;
      ZSTD_ldm_makeEntryAndInsertByTag
                ((ldmState_t *)CONCAT44(uVar19,in_stack_fffffffffffffe20),(U64)ldmState_00,UVar10,
                 (U32)in_stack_fffffffffffffe10,ldmParams_00);
      if ((BYTE *)(lVar16 + lVar15) <= (BYTE *)((long)plVar13 - uVar18)) {
        uVar6 = in_RDX->enableLdm;
        uVar8 = in_RDX->hashLog;
        ldmParams_01.windowLog = uVar8;
        ldmParams_01.hashEveryLog = uVar6;
        ldmParams_01.bucketSizeLog = in_stack_fffffffffffffe48;
        ldmParams_01._0_8_ = pBVar22;
        ldmParams_01.minMatchLength = uVar24;
        local_b8 = ZSTD_ldm_fillLdmHashTable
                             (state,(U64)lastHash,(BYTE *)CONCAT44(uVar19,in_stack_fffffffffffffe20)
                              ,(BYTE *)ldmState_00,in_stack_fffffffffffffe10,
                              (U32)((ulong)in_stack_fffffffffffffe08 >> 0x20),ldmParams_01);
        local_b0 = (BYTE *)(lVar16 + lVar15 + -1);
      }
      local_a8 = (BYTE *)(lVar15 + lVar16);
      local_a0 = local_a8;
    }
  } while( true );
}

Assistant:

static size_t ZSTD_ldm_generateSequences_internal(
        ldmState_t* ldmState, rawSeqStore_t* rawSeqStore,
        ldmParams_t const* params, void const* src, size_t srcSize)
{
    /* LDM parameters */
    int const extDict = ZSTD_window_hasExtDict(ldmState->window);
    U32 const minMatchLength = params->minMatchLength;
    U64 const hashPower = ldmState->hashPower;
    U32 const hBits = params->hashLog - params->bucketSizeLog;
    U32 const ldmBucketSize = 1U << params->bucketSizeLog;
    U32 const hashEveryLog = params->hashEveryLog;
    U32 const ldmTagMask = (1U << params->hashEveryLog) - 1;
    /* Prefix and extDict parameters */
    U32 const dictLimit = ldmState->window.dictLimit;
    U32 const lowestIndex = extDict ? ldmState->window.lowLimit : dictLimit;
    BYTE const* const base = ldmState->window.base;
    BYTE const* const dictBase = extDict ? ldmState->window.dictBase : NULL;
    BYTE const* const dictStart = extDict ? dictBase + lowestIndex : NULL;
    BYTE const* const dictEnd = extDict ? dictBase + dictLimit : NULL;
    BYTE const* const lowPrefixPtr = base + dictLimit;
    /* Input bounds */
    BYTE const* const istart = (BYTE const*)src;
    BYTE const* const iend = istart + srcSize;
    BYTE const* const ilimit = iend - MAX(minMatchLength, HASH_READ_SIZE);
    /* Input positions */
    BYTE const* anchor = istart;
    BYTE const* ip = istart;
    /* Rolling hash */
    BYTE const* lastHashed = NULL;
    U64 rollingHash = 0;

    while (ip <= ilimit) {
        size_t mLength;
        U32 const current = (U32)(ip - base);
        size_t forwardMatchLength = 0, backwardMatchLength = 0;
        ldmEntry_t* bestEntry = NULL;
        if (ip != istart) {
            rollingHash = ZSTD_ldm_updateHash(rollingHash, lastHashed[0],
                                              lastHashed[minMatchLength],
                                              hashPower);
        } else {
            rollingHash = ZSTD_ldm_getRollingHash(ip, minMatchLength);
        }
        lastHashed = ip;

        /* Do not insert and do not look for a match */
        if (ZSTD_ldm_getTag(rollingHash, hBits, hashEveryLog) != ldmTagMask) {
           ip++;
           continue;
        }

        /* Get the best entry and compute the match lengths */
        {
            ldmEntry_t* const bucket =
                ZSTD_ldm_getBucket(ldmState,
                                   ZSTD_ldm_getSmallHash(rollingHash, hBits),
                                   *params);
            ldmEntry_t* cur;
            size_t bestMatchLength = 0;
            U32 const checksum = ZSTD_ldm_getChecksum(rollingHash, hBits);

            for (cur = bucket; cur < bucket + ldmBucketSize; ++cur) {
                size_t curForwardMatchLength, curBackwardMatchLength,
                       curTotalMatchLength;
                if (cur->checksum != checksum || cur->offset <= lowestIndex) {
                    continue;
                }
                if (extDict) {
                    BYTE const* const curMatchBase =
                        cur->offset < dictLimit ? dictBase : base;
                    BYTE const* const pMatch = curMatchBase + cur->offset;
                    BYTE const* const matchEnd =
                        cur->offset < dictLimit ? dictEnd : iend;
                    BYTE const* const lowMatchPtr =
                        cur->offset < dictLimit ? dictStart : lowPrefixPtr;

                    curForwardMatchLength = ZSTD_count_2segments(
                                                ip, pMatch, iend,
                                                matchEnd, lowPrefixPtr);
                    if (curForwardMatchLength < minMatchLength) {
                        continue;
                    }
                    curBackwardMatchLength =
                        ZSTD_ldm_countBackwardsMatch(ip, anchor, pMatch,
                                                     lowMatchPtr);
                    curTotalMatchLength = curForwardMatchLength +
                                          curBackwardMatchLength;
                } else { /* !extDict */
                    BYTE const* const pMatch = base + cur->offset;
                    curForwardMatchLength = ZSTD_count(ip, pMatch, iend);
                    if (curForwardMatchLength < minMatchLength) {
                        continue;
                    }
                    curBackwardMatchLength =
                        ZSTD_ldm_countBackwardsMatch(ip, anchor, pMatch,
                                                     lowPrefixPtr);
                    curTotalMatchLength = curForwardMatchLength +
                                          curBackwardMatchLength;
                }

                if (curTotalMatchLength > bestMatchLength) {
                    bestMatchLength = curTotalMatchLength;
                    forwardMatchLength = curForwardMatchLength;
                    backwardMatchLength = curBackwardMatchLength;
                    bestEntry = cur;
                }
            }
        }

        /* No match found -- continue searching */
        if (bestEntry == NULL) {
            ZSTD_ldm_makeEntryAndInsertByTag(ldmState, rollingHash,
                                             hBits, current,
                                             *params);
            ip++;
            continue;
        }

        /* Match found */
        mLength = forwardMatchLength + backwardMatchLength;
        ip -= backwardMatchLength;

        {
            /* Store the sequence:
             * ip = current - backwardMatchLength
             * The match is at (bestEntry->offset - backwardMatchLength)
             */
            U32 const matchIndex = bestEntry->offset;
            U32 const offset = current - matchIndex;
            rawSeq* const seq = rawSeqStore->seq + rawSeqStore->size;

            /* Out of sequence storage */
            if (rawSeqStore->size == rawSeqStore->capacity)
                return ERROR(dstSize_tooSmall);
            seq->litLength = (U32)(ip - anchor);
            seq->matchLength = (U32)mLength;
            seq->offset = offset;
            rawSeqStore->size++;
        }

        /* Insert the current entry into the hash table */
        ZSTD_ldm_makeEntryAndInsertByTag(ldmState, rollingHash, hBits,
                                         (U32)(lastHashed - base),
                                         *params);

        assert(ip + backwardMatchLength == lastHashed);

        /* Fill the hash table from lastHashed+1 to ip+mLength*/
        /* Heuristic: don't need to fill the entire table at end of block */
        if (ip + mLength <= ilimit) {
            rollingHash = ZSTD_ldm_fillLdmHashTable(
                              ldmState, rollingHash, lastHashed,
                              ip + mLength, base, hBits, *params);
            lastHashed = ip + mLength - 1;
        }
        ip += mLength;
        anchor = ip;
    }
    return iend - anchor;
}